

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

void __thiscall
tchecker::system::system_t::system_t(system_t *this,string *name,attributes_t *attributes)

{
  attributes_t *attributes_local;
  string *name_local;
  system_t *this_local;
  
  clocks_t::clocks_t(&this->super_clocks_t);
  edges_t::edges_t(&this->super_edges_t);
  events_t::events_t(&this->super_events_t);
  intvars_t::intvars_t(&this->super_intvars_t);
  locs_t::locs_t(&this->super_locs_t);
  processes_t::processes_t(&this->super_processes_t);
  synchronizations_t::synchronizations_t(&this->super_synchronizations_t);
  std::__cxx11::string::string((string *)&this->_name,(string *)name);
  attributes_t::attributes_t(&this->_attributes,attributes);
  return;
}

Assistant:

system_t::system_t(std::string const & name, tchecker::system::attributes_t const & attributes)
    : _name(name), _attributes(attributes)
{
}